

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

bool local::test_uintwide_t_0008192(void)

{
  bool bVar1;
  ostream *poVar2;
  test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void>
  test_uintwide_t_n_binary_ops_template_instance;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"running: test_uintwide_t_0008192");
  std::endl<char,std::char_traits<char>>(poVar2);
  test_uintwide_t_n_binary_ops_template_instance.super_test_uintwide_t_n_binary_ops_base.
  super_test_uintwide_t_n_base.number_of_cases = 0x100;
  test_uintwide_t_n_binary_ops_template_instance.super_test_uintwide_t_n_binary_ops_base.
  super_test_uintwide_t_n_base._vptr_test_uintwide_t_n_base =
       (_func_int **)&PTR__test_uintwide_t_n_binary_ops_template_00216ae8;
  test_uintwide_t_n_binary_ops_template_instance.a_local.
  super__Vector_base<math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.a_local.
  super__Vector_base<math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.a_local.
  super__Vector_base<math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.b_local.
  super__Vector_base<math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.b_local.
  super__Vector_base<math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.b_local.
  super__Vector_base<math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.a_boost.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.a_boost.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.a_boost.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.b_boost.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.b_boost.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  test_uintwide_t_n_binary_ops_template_instance.b_boost.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void>::do_test
                    (&test_uintwide_t_n_binary_ops_template_instance,4);
  test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void>::
  ~test_uintwide_t_n_binary_ops_template(&test_uintwide_t_n_binary_ops_template_instance);
  return bVar1;
}

Assistant:

auto test_uintwide_t_0008192() -> bool
{
  #if !defined(UINTWIDE_T_REDUCE_TEST_DEPTH)
  constexpr auto count = static_cast<std::size_t>(1UL << 8U);
  #else
  constexpr auto count = static_cast<std::size_t>(1UL << 5U);
  #endif

  std::cout << "running: test_uintwide_t_0008192" << std::endl;
  test_uintwide_t_n_binary_ops_template<8192U> test_uintwide_t_n_binary_ops_template_instance(count); // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
  const auto result_is_ok =
    test_uintwide_t_n_binary_ops_template_instance.do_test(test_uintwide_t_n_binary_ops_rounds);
  return result_is_ok;
}